

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  string_view s_00;
  size_t in_RSI;
  basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_> *in_RDI;
  allocator<wchar_t> *in_stack_ffffffffffffff98;
  anon_class_8_1_8991fb9c_for_f in_stack_ffffffffffffffe0;
  basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_> *pbVar1;
  
  pbVar1 = in_RDI;
  basic_memory_buffer<wchar_t,_500UL,_fmt::v11::detail::allocator<wchar_t>_>::basic_memory_buffer
            (in_RDI,in_stack_ffffffffffffff98);
  s_00.size_ = in_RSI;
  s_00.data_ = (char *)pbVar1;
  for_each_codepoint<fmt::v11::detail::utf8_to_utf16::utf8_to_utf16(fmt::v11::basic_string_view<char>)::__0>
            (s_00,in_stack_ffffffffffffffe0);
  buffer<wchar_t>::push_back(&in_RDI->super_buffer<wchar_t>,(wchar_t *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}